

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_bspline_bundle_on_tec
          (REF_GEOM ref_geom,REF_INT degree,REF_INT n_control_point,REF_DBL *bundle,REF_INT faceid,
          char *filename)

{
  REF_STATUS RVar1;
  uint uVar2;
  FILE *__s;
  REF_DBL *control_points;
  REF_DBL *control_points_00;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t __size;
  int iVar8;
  double t;
  REF_DBL uv [2];
  REF_DBL xyz [3];
  REF_DBL local_78;
  REF_DBL local_70;
  double local_68;
  double local_60;
  ulong local_58;
  REF_GEOM local_50;
  REF_DBL local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_50 = ref_geom;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar7 = "unable to open file";
    uVar5 = 0x1180;
  }
  else {
    fwrite("title=\"refine bspine bundle\"\n",0x1d,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"u\" \"v\" \"t\"\n",0x24,1,__s);
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1185
             ,"ref_geom_bspline_bundle_on_tec","malloc u of REF_DBL negative");
      return 1;
    }
    __size = (ulong)(uint)n_control_point << 3;
    control_points = (REF_DBL *)malloc(__size);
    if (control_points == (REF_DBL *)0x0) {
      pcVar7 = "malloc u of REF_DBL NULL";
      uVar5 = 0x1185;
    }
    else {
      control_points_00 = (REF_DBL *)malloc(__size);
      if (control_points_00 != (REF_DBL *)0x0) {
        lVar4 = (long)(degree + n_control_point);
        if (n_control_point != 0) {
          sVar3 = 0;
          do {
            *(undefined8 *)((long)control_points + sVar3) =
                 *(undefined8 *)((long)bundle + sVar3 * 2 + lVar4 * 8 + 8);
            *(undefined8 *)((long)control_points_00 + sVar3) =
                 *(undefined8 *)((long)bundle + sVar3 * 2 + lVar4 * 8 + 0x10);
            sVar3 = sVar3 + 8;
          } while (__size != sVar3);
        }
        iVar8 = 0;
        local_58 = (ulong)(uint)n_control_point;
        fprintf(__s,"zone t=\"bundle\", i=%d, datapacking=%s\n",0x3e9,"point");
        uVar6 = local_58;
        local_60 = *bundle;
        local_68 = bundle[lVar4];
        do {
          t = ((double)iVar8 / 1000.0) * local_68 + (1.0 - (double)iVar8 / 1000.0) * local_60;
          RVar1 = ref_geom_bspline_eval(degree,(REF_INT)uVar6,bundle,t,control_points,&local_78);
          if (RVar1 != 0) {
            uVar5 = 0x1195;
LAB_001538f8:
            uVar2 = 1;
            pcVar7 = "eval";
            uVar6 = 1;
LAB_00153927:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar5,"ref_geom_bspline_bundle_on_tec",uVar6,pcVar7);
            return uVar2;
          }
          RVar1 = ref_geom_bspline_eval(degree,(REF_INT)uVar6,bundle,t,control_points_00,&local_70);
          if (RVar1 != 0) {
            uVar5 = 0x1197;
            goto LAB_001538f8;
          }
          uVar2 = ref_egads_eval_at(local_50,2,faceid,&local_78,&local_48,(REF_DBL *)0x0);
          if (uVar2 != 0) {
            pcVar7 = "eval face";
            uVar5 = 0x1199;
            uVar6 = (ulong)uVar2;
            goto LAB_00153927;
          }
          fprintf(__s,"%f %f %f %f %f %f\n",local_48,local_40,local_38,local_78,local_70,t);
          iVar8 = iVar8 + 1;
          if (iVar8 == 0x3e9) {
            free(control_points_00);
            free(control_points);
            fclose(__s);
            return 0;
          }
        } while( true );
      }
      pcVar7 = "malloc v of REF_DBL NULL";
      uVar5 = 0x1186;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_bspline_bundle_on_tec",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_bundle_on_tec(
    REF_GEOM ref_geom, REF_INT degree, REF_INT n_control_point, REF_DBL *bundle,
    REF_INT faceid, const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *u, *v, uv[2], *knots, xyz[3];
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine bundle\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"u\" \"v\" \"t\"\n");

  ref_malloc(u, n_control_point, REF_DBL);
  ref_malloc(v, n_control_point, REF_DBL);
  knots = bundle;
  for (i = 0; i < n_control_point; i++) {
    u[i] = bundle[nknot + 0 + 2 * i];
    v[i] = bundle[nknot + 1 + 2 * i];
  }

  fprintf(file, "zone t=\"bundle\", i=%d, datapacking=%s\n", n, "point");
  t0 = knots[0];
  t1 = knots[nknot - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, u, &(uv[0])),
        "eval");
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, v, &(uv[1])),
        "eval");
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, uv, xyz, NULL),
        "eval face");
    fprintf(file, "%f %f %f %f %f %f\n", xyz[0], xyz[1], xyz[2], uv[0], uv[1],
            t);
  }
  ref_free(v);
  ref_free(u);
  fclose(file);
  return REF_SUCCESS;
}